

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

void __thiscall
duckdb::ClientContext::RunFunctionInTransactionInternal
          (ClientContext *this,ClientContextLock *lock,function<void_()> *fun,
          bool requires_valid_transaction)

{
  bool bVar1;
  MetaTransaction *o;
  _Head_base<0UL,_duckdb::MetaTransaction_*,_false> _Var2;
  TransactionException *this_00;
  byte bVar3;
  ErrorData error;
  
  _Var2._M_head_impl =
       (this->transaction).current_transaction.
       super_unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::MetaTransaction_*,_std::default_delete<duckdb::MetaTransaction>_>
       .super__Head_base<0UL,_duckdb::MetaTransaction_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (MetaTransaction *)0x0 && requires_valid_transaction) {
    o = TransactionContext::ActiveTransaction(&this->transaction);
    bVar1 = ValidChecker::IsInvalidated<duckdb::MetaTransaction>(o);
    if (bVar1) {
      this_00 = (TransactionException *)__cxa_allocate_exception(0x10);
      ErrorManager::FormatException<>((string *)&error,this,INVALIDATED_TRANSACTION);
      TransactionException::TransactionException(this_00,(string *)&error);
      __cxa_throw(this_00,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
    }
    _Var2._M_head_impl =
         (this->transaction).current_transaction.
         super_unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::MetaTransaction_*,_std::default_delete<duckdb::MetaTransaction>_>
         .super__Head_base<0UL,_duckdb::MetaTransaction_*,_false>._M_head_impl;
  }
  bVar3 = _Var2._M_head_impl == (MetaTransaction *)0x0 & (this->transaction).auto_commit;
  if (bVar3 == 1) {
    TransactionContext::BeginTransaction(&this->transaction);
  }
  ::std::function<void_()>::operator()(fun);
  if (bVar3 != 0) {
    TransactionContext::Commit(&this->transaction);
    return;
  }
  return;
}

Assistant:

void ClientContext::RunFunctionInTransactionInternal(ClientContextLock &lock, const std::function<void(void)> &fun,
                                                     bool requires_valid_transaction) {
	if (requires_valid_transaction && transaction.HasActiveTransaction() &&
	    ValidChecker::IsInvalidated(ActiveTransaction())) {
		throw TransactionException(ErrorManager::FormatException(*this, ErrorType::INVALIDATED_TRANSACTION));
	}
	// check if we are on AutoCommit. In this case we should start a transaction
	bool require_new_transaction = transaction.IsAutoCommit() && !transaction.HasActiveTransaction();
	if (require_new_transaction) {
		D_ASSERT(!active_query);
		transaction.BeginTransaction();
	}
	try {
		fun();
	} catch (std::exception &ex) {
		ErrorData error(ex);
		bool invalidates_transaction = true;
		if (!Exception::InvalidatesTransaction(error.Type())) {
			// standard exceptions don't invalidate the transaction
			invalidates_transaction = false;
		} else if (Exception::InvalidatesDatabase(error.Type())) {
			auto &db_instance = DatabaseInstance::GetDatabase(*this);
			ValidChecker::Invalidate(db_instance, error.RawMessage());
		}
		if (require_new_transaction) {
			transaction.Rollback(error);
		} else if (invalidates_transaction) {
			ValidChecker::Invalidate(ActiveTransaction(), error.RawMessage());
		}
		throw;
	}
	if (require_new_transaction) {
		transaction.Commit();
	}
}